

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

bool __thiscall
choc::value::Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::operator==
          (AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *this,
          AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *other)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  
  if (this->size == other->size) {
    uVar3 = 0xffffffffffffffff;
    lVar2 = 0;
    do {
      uVar3 = uVar3 + 1;
      bVar4 = this->size <= uVar3;
      if (bVar4) {
        return bVar4;
      }
      bVar1 = ComplexArray::RepeatedGroup::operator==
                        ((RepeatedGroup *)((long)&this->items->repetitions + lVar2),
                         (RepeatedGroup *)((long)&other->items->repetitions + lVar2));
      lVar2 = lVar2 + 0x28;
    } while (bVar1);
  }
  else {
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool operator== (const AllocatedVector& other) const
    {
        if (size != other.size)
            return false;

        for (decltype (size) i = 0; i < size; ++i)
            if (! (items[i] == other.items[i]))
                return false;

        return true;
    }